

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_rc_Ptr.h
# Opt level: O0

int __thiscall
axl::rc::Ptr<axl::mem::Block>::copy(Ptr<axl::mem::Block> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  RefCount *this_00;
  
  this->m_p = (Block *)dst;
  this_00 = this->m_refCount;
  if (this_00 != (RefCount *)src) {
    this_00 = (RefCount *)this;
    if (src != (EVP_PKEY_CTX *)0x0) {
      RefCount::addRef((RefCount *)0x124bc4);
      this_00 = (RefCount *)this;
    }
    if (this_00->m_freeFunc != (FreeFunc *)0x0) {
      RefCount::release(this_00);
    }
    this_00->m_freeFunc = (FreeFunc *)src;
  }
  return (int)this_00;
}

Assistant:

void
	copy(
		T* p,
		RefCount* refCount
	) {
		m_p = p;

		if (m_refCount == refCount)
			return;

		if (refCount)
			refCount->addRef();

		if (m_refCount)
			m_refCount->release();

		m_refCount = refCount;
	}